

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O1

void __thiscall Scs::Socket::~Socket(Socket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (this->m_socket != -1) {
    shutdown(this->m_socket,1);
    close(this->m_socket);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->m_address).super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

Socket::~Socket()
{
	if (m_socket != INVALID_SOCKET)
	{
		shutdown(m_socket, SD_SEND);
#ifdef SCS_WINDOWS
		closesocket(m_socket);
#else
        close(m_socket);
#endif
	}
}